

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

void pm_read_short(PmInternal *midi,PmEvent *event)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  PmError PVar5;
  
  if (midi == (PmInternal *)0x0) {
    __assert_fail("midi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x3fb,"void pm_read_short(PmInternal *, PmEvent *)");
  }
  bVar2 = (byte)event->message;
  if ((((uint)midi->filters >> (bVar2 >> 4)) >> 0x10 & 1) == 0) {
    uVar4 = (uint)bVar2;
    if ((((bVar2 & 0xf8) != 0xf8) || (((uint)midi->filters >> (uVar4 & 0xf) & 1) == 0)) &&
       (((~uVar4 & 0xf0) == 0 || (((uint)midi->channel_mask >> (uVar4 & 0xf) & 1) != 0)))) {
      if (((char)bVar2 < '\0') && (midi->sysex_in_progress != 0)) {
        if ((bVar2 & 0xf8) == 0xf8) {
          iVar3 = midi->sysex_message_count;
          iVar1 = iVar3 + 1;
          midi->sysex_message_count = iVar1;
          midi->sysex_message = midi->sysex_message | uVar4 << ((byte)(iVar3 << 3) & 0x1f);
          if (iVar1 != 4) {
            return;
          }
          pm_flush_sysex(midi,event->timestamp);
          return;
        }
      }
      else {
        PVar5 = Pm_Enqueue(midi->queue,event);
        if (PVar5 != pmBufferOverflow) {
          return;
        }
      }
      midi->sysex_in_progress = 0;
    }
  }
  return;
}

Assistant:

void pm_read_short(PmInternal *midi, PmEvent *event)
{ 
    int status;
    /* arg checking */
    assert(midi != NULL);
    /* midi filtering is applied here */
    status = Pm_MessageStatus(event->message);
    if (!pm_status_filtered(status, midi->filters)
        && (!is_real_time(status) || 
            !pm_realtime_filtered(status, midi->filters))
        && !pm_channel_filtered(status, midi->channel_mask)) {
        /* if sysex is in progress and we get a status byte, it had
           better be a realtime message or the starting SYSEX byte;
           otherwise, we exit the sysex_in_progress state
         */
        if (midi->sysex_in_progress && (status & MIDI_STATUS_MASK)) {
            /* two choices: real-time or not. If it's real-time, then
             * this should be delivered as a sysex byte because it is
             * embedded in a sysex message
             */
            if (is_real_time(status)) {
                midi->sysex_message |= 
                        (status << (8 * midi->sysex_message_count++));
                if (midi->sysex_message_count == 4) {
                    pm_flush_sysex(midi, event->timestamp);
                }
            } else { /* otherwise, it's not real-time. This interrupts
                      * a sysex message in progress */
                midi->sysex_in_progress = FALSE;
            }
        } else if (Pm_Enqueue(midi->queue, event) == pmBufferOverflow) {
            midi->sysex_in_progress = FALSE;
        }
    }
}